

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z80.cpp
# Opt level: O2

int z80GetRegister8(char *source,int *RetLen)

{
  short sVar1;
  int iVar2;
  long lVar3;
  
  lVar3 = 0;
  while( true ) {
    if (lVar3 == 0x80) {
      return -1;
    }
    sVar1 = *(short *)((long)&Z80Registers8[0].len + lVar3);
    iVar2 = strncmp(*(char **)((long)&Z80Registers8[0].name + lVar3),source,(long)sVar1);
    if (((iVar2 == 0) && ((ulong)(byte)source[sVar1] < 0x2d)) &&
       ((0x120000000001U >> ((ulong)(byte)source[sVar1] & 0x3f) & 1) != 0)) break;
    lVar3 = lVar3 + 0x10;
  }
  *RetLen = (int)sVar1;
  return (int)*(short *)((long)&Z80Registers8[0].num + lVar3);
}

Assistant:

int z80GetRegister8(char* source, int& RetLen)
{
	for (int z = 0; Z80Registers8[z].name != NULL; z++)
	{
		int len = Z80Registers8[z].len;
		if (strncmp(Z80Registers8[z].name,source,len) == 0)
		{
			switch (source[len])
			{
			case ')': case ',': case 0:
				RetLen = len;
				return Z80Registers8[z].num;
			default:
				break;
			}
		}
	}
	return -1;
}